

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

void __thiscall PrintMenu::act(PrintMenu *this,Restaurant *restaurant)

{
  bool bVar1;
  int iVar2;
  vector<Dish,_std::allocator<Dish>_> *this_00;
  ostream *poVar3;
  PrintMenu local_88;
  undefined1 local_58 [40];
  Dish *i;
  iterator __end1;
  iterator __begin1;
  vector<Dish,_std::allocator<Dish>_> *__range1;
  Restaurant *restaurant_local;
  PrintMenu *this_local;
  
  this_00 = Restaurant::getMenu(restaurant);
  __end1 = std::vector<Dish,_std::allocator<Dish>_>::begin(this_00);
  i = (Dish *)std::vector<Dish,_std::allocator<Dish>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Dish_*,_std::vector<Dish,_std::allocator<Dish>_>_>
                                *)&i);
    if (!bVar1) break;
    local_58._32_8_ =
         __gnu_cxx::__normal_iterator<Dish_*,_std::vector<Dish,_std::allocator<Dish>_>_>::operator*
                   (&__end1);
    Dish::getName_abi_cxx11_((Dish *)local_58);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_58);
    poVar3 = std::operator<<(poVar3," ");
    Dish::getType((Dish *)local_58._32_8_);
    findMyType_abi_cxx11_(&local_88,(DishType)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_88);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = Dish::getPrice((Dish *)local_58._32_8_);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"NIS \n");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_58);
    __gnu_cxx::__normal_iterator<Dish_*,_std::vector<Dish,_std::allocator<Dish>_>_>::operator++
              (&__end1);
  }
  BaseAction::complete(&this->super_BaseAction);
  return;
}

Assistant:

void PrintMenu::act(Restaurant &restaurant)
{
    for (auto &i : restaurant.getMenu()) {
        std::cout << i.getName() << " " << findMyType(i.getType()) << " " << i.getPrice() << "NIS \n";
    }
    complete();
}